

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall ki::dml::Field<int>::set_value(Field<int> *this,FieldBase *other)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  char *pcVar4;
  value_error *this_00;
  Field<int> *real_other;
  string sStack_1b8;
  ostringstream oss;
  
  bVar1 = FieldBase::is_type<int>(other);
  if (bVar1) {
    this->m_value = *(int *)&other[1].super_Serializable._vptr_Serializable;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Tried to copy value from ");
  iVar2 = (*(other->super_Serializable)._vptr_Serializable[5])(other);
  poVar3 = std::operator<<(poVar3,(char *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3," field to ");
  pcVar4 = get_type_name(this);
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3," field.");
  this_00 = (value_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_00,&sStack_1b8);
  __cxa_throw(this_00,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_value(FieldBase *other) final
		{
			if (other->is_type<ValueT>())
			{
				auto *real_other = dynamic_cast<Field<ValueT> *>(other);
				set_value(real_other->get_value());
			}
			else
			{
				std::ostringstream oss;
				oss << "Tried to copy value from " <<
					other->get_type_name() << " field to " <<
					get_type_name() << " field.";
				throw value_error(oss.str());
			}
		}